

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

_Bool fnet_socket_recvfrom
                (fnet_socket_t sock,char *buf,size_t len,size_t *read_len,fnet_address_t *addr)

{
  ulong uVar1;
  _Bool _Var2;
  socklen_t sockaddr_len;
  socklen_t local_c;
  
  if (buf == (char *)0x0 || read_len == (size_t *)0x0) {
    _Var2 = false;
  }
  else {
    *read_len = 0;
    local_c = 0x80;
    uVar1 = recvfrom(sock,buf,len,0,(sockaddr *)addr,&local_c);
    _Var2 = (uVar1 & 0xffffffff) != 0xffffffff;
    if (_Var2) {
      *read_len = (long)(int)uVar1;
    }
  }
  return _Var2;
}

Assistant:

bool fnet_socket_recvfrom(fnet_socket_t sock, char *buf, size_t len, size_t *read_len, fnet_address_t *addr)
{
    if (!read_len || !buf)
    {
        FLOG_ERR("Invalid arguments");
        return false;
    }

    *read_len = 0;
    socklen_t sockaddr_len = sizeof *addr;

    int res = recvfrom(sock, buf, len, 0, (struct sockaddr *)addr, &sockaddr_len);
    switch(res)
    {
        case -1:
        {
            FLOG_ERR("Unable to recv data");
            return false;
        }

        default:
            break;
    }

    *read_len = res;

    return true;
}